

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall FixedSizeCache<int>::FixedSizeCache(FixedSizeCache<int> *this,int size)

{
  this->_count = 0;
  (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  initialize(this,size);
  return;
}

Assistant:

FixedSizeCache(int const size = 1000) :
        _count(0)
    {
        this->initialize(size);
    }